

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::dump(Matrix *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  real *prVar2;
  Matrix *in_RSI;
  long in_RDI;
  int64_t j;
  int64_t i;
  int64_t in_stack_ffffffffffffffc8;
  Matrix *this_01;
  long local_20;
  long local_18;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RSI,*(long *)(in_RDI + 0x18));
  poVar1 = std::operator<<(poVar1," ");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0x20));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < *(long *)(in_RDI + 0x18); local_18 = local_18 + 1) {
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x20); local_20 = local_20 + 1) {
      if (0 < local_20) {
        std::operator<<((ostream *)in_RSI," ");
      }
      this_01 = in_RSI;
      prVar2 = at(in_RSI,in_stack_ffffffffffffffc8,0x1775f2);
      std::ostream::operator<<(this_01,*prVar2);
    }
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Matrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}